

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fapi.c
# Opt level: O0

void ga_release_(Integer *g_a,Integer *ilo,Integer *ihi,Integer *jlo,Integer *jhi)

{
  undefined8 *in_RCX;
  Integer *in_RDX;
  Integer *in_RSI;
  Integer *in_RDI;
  undefined8 *in_R8;
  Integer hi [2];
  Integer lo [2];
  Integer local_48;
  undefined8 local_40;
  Integer local_38;
  undefined8 local_30;
  
  local_38 = *in_RSI;
  local_30 = *in_RCX;
  local_48 = *in_RDX;
  local_40 = *in_R8;
  pnga_release(*in_RDI,&local_38,&local_48);
  return;
}

Assistant:

void FATR ga_release_(Integer *g_a, Integer *ilo, Integer *ihi,
                      Integer *jlo, Integer *jhi)
{
  Integer lo[2], hi[2];
  lo[0]=*ilo;
  lo[1]=*jlo;
  hi[0]=*ihi;
  hi[1]=*jhi;
  wnga_release(*g_a, lo, hi);
}